

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O0

ze_result_t loader::zesInit(zes_init_flags_t flags)

{
  vector<loader::driver_t,_std::allocator<loader::driver_t>_> *this;
  bool bVar1;
  bool bVar2;
  ze_result_t zVar3;
  reference pdVar4;
  driver_t *drv;
  iterator __end1;
  iterator __begin1;
  driver_vector_t *__range1;
  ze_result_t local_10;
  bool atLeastOneDriverValid;
  ze_result_t result;
  zes_init_flags_t flags_local;
  
  local_10 = ZE_RESULT_SUCCESS;
  bVar1 = false;
  this = *(vector<loader::driver_t,_std::allocator<loader::driver_t>_> **)(context + 0x1610);
  __end1 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::begin(this);
  drv = (driver_t *)std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::end(this);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
                                     *)&drv), bVar2) {
    pdVar4 = __gnu_cxx::
             __normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
             ::operator*(&__end1);
    if ((pdVar4->initStatus == ZE_RESULT_SUCCESS) && (pdVar4->initSysManStatus == ZE_RESULT_SUCCESS)
       ) {
      if ((pdVar4->dditable).zes.Global.pfnInit == (zes_pfnInit_t)0x0) {
        pdVar4->initSysManStatus = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        zVar3 = (*(pdVar4->dditable).zes.Global.pfnInit)(flags);
        pdVar4->initSysManStatus = zVar3;
        if (pdVar4->initSysManStatus == ZE_RESULT_SUCCESS) {
          bVar1 = true;
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
    ::operator++(&__end1);
  }
  if (!bVar1) {
    local_10 = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return local_10;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesInit(
        zes_init_flags_t flags                          ///< [in] initialization flags.
                                                        ///< currently unused, must be 0 (default).
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        bool atLeastOneDriverValid = false;
        for( auto& drv : *loader::context->sysmanInstanceDrivers )
        {
            if(drv.initStatus != ZE_RESULT_SUCCESS || drv.initSysManStatus != ZE_RESULT_SUCCESS)
                continue;
            if (!drv.dditable.zes.Global.pfnInit) {
                drv.initSysManStatus = ZE_RESULT_ERROR_UNINITIALIZED;
                continue;
            }
            drv.initSysManStatus = drv.dditable.zes.Global.pfnInit( flags );
            if(drv.initSysManStatus == ZE_RESULT_SUCCESS)
                atLeastOneDriverValid = true;
        }

        if(!atLeastOneDriverValid)
            result=ZE_RESULT_ERROR_UNINITIALIZED;

        return result;
    }